

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::WallyUtil::ConvertEntropyToMnemonic
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,ByteData *entropy,string *language)

{
  pointer w;
  uchar *bytes;
  size_type bytes_len;
  undefined8 uVar1;
  char *wally_string;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffee0;
  string *message;
  CfdError error_code;
  CfdException *this;
  allocator local_e9;
  string local_e8 [39];
  undefined1 local_c1;
  undefined1 local_c0 [8];
  string mnemonic_sentence;
  CfdSourceLocation local_78;
  int local_4c;
  WallyUtil *pWStack_48;
  int ret;
  char *mnemonic_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy_bytes;
  words *wally_wordlist;
  string *language_local;
  ByteData *entropy_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *mnemonic;
  
  this = (CfdException *)__return_storage_ptr__;
  entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)Bip39GetWordlist(language);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&mnemonic_bytes,
                     entropy);
  w = entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage;
  pWStack_48 = (WallyUtil *)0x0;
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3fa578);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&mnemonic_bytes);
  local_4c = bip39_mnemonic_from_bytes((words *)w,bytes,bytes_len,(char **)&stack0xffffffffffffffb8)
  ;
  if (local_4c == 0) {
    ConvertStringAndFree_abi_cxx11_((string *)local_c0,pWStack_48,wally_string);
    local_c1 = 0;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e8," ",&local_e9);
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)__return_storage_ptr__,(string *)local_c0,(string *)local_e8);
    ::std::__cxx11::string::~string(local_e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    local_c1 = 1;
    ::std::__cxx11::string::~string((string *)local_c0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffee0)
    ;
    return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this;
  }
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_wally_util.cpp"
               ,0x2f);
  error_code = (CfdError)((ulong)__return_storage_ptr__ >> 0x20);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0xef;
  local_78.funcname = "ConvertEntropyToMnemonic";
  logger::warn<int&>(&local_78,"Convert entropy to mnemonic error. ret=[{}]",&local_4c);
  mnemonic_sentence.field_2._M_local_buf[0xe] = '\x01';
  uVar1 = __cxa_allocate_exception(0x30);
  message = (string *)(mnemonic_sentence.field_2._M_local_buf + 0xf);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff68,"Convert entropy to mnemonic error.",
             (allocator *)message);
  CfdException::CfdException(this,error_code,message);
  mnemonic_sentence.field_2._M_local_buf[0xe] = '\0';
  __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<std::string> WallyUtil::ConvertEntropyToMnemonic(
    const ByteData& entropy, const std::string& language) {
  words* wally_wordlist = Bip39GetWordlist(language);

  std::vector<uint8_t> entropy_bytes = entropy.GetBytes();
  char* mnemonic_bytes = NULL;
  int ret = bip39_mnemonic_from_bytes(
      wally_wordlist, entropy_bytes.data(), entropy_bytes.size(),
      &mnemonic_bytes);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Convert entropy to mnemonic error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Convert entropy to mnemonic error.");
  }

  std::string mnemonic_sentence =
      WallyUtil::ConvertStringAndFree(mnemonic_bytes);
  std::vector<std::string> mnemonic =
      StringUtil::Split(mnemonic_sentence, kMnemonicDelimiter);

  return mnemonic;
}